

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O0

void mapAddIsland(Layer *l,int *out,longlong areaX,longlong areaZ,int areaWidth,int areaHeight)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  char cVar10;
  int64_t cs_1;
  int64_t chunkZ_1;
  int64_t chunkX_1;
  int inc;
  int v;
  int64_t cs;
  int64_t chunkZ;
  int64_t chunkX;
  int v11;
  int v22;
  int v02;
  int v20;
  int v00;
  int64_t ss;
  int64_t ws;
  int z;
  int x;
  int pHeight;
  int pWidth;
  int pZ;
  int pX;
  int areaHeight_local;
  int areaWidth_local;
  longlong areaZ_local;
  longlong areaX_local;
  int *out_local;
  Layer *l_local;
  
  iVar6 = areaWidth + 2;
  (*l->p->getMap)(l->p,out,(long)((int)areaX + -1),(long)((int)areaZ + -1),iVar6,areaHeight + 2);
  lVar5 = l->worldSeed;
  lVar7 = lVar5 * (lVar5 * 0x5851f42d4c957f2d + 0x14057b7ef767814f);
  for (ws._0_4_ = 0; (int)ws < areaHeight; ws._0_4_ = (int)ws + 1) {
    for (ws._4_4_ = 0; ws._4_4_ < areaWidth; ws._4_4_ = ws._4_4_ + 1) {
      iVar9 = out[ws._4_4_ + (int)ws * iVar6];
      iVar1 = out[ws._4_4_ + 2 + (int)ws * iVar6];
      iVar2 = out[ws._4_4_ + ((int)ws + 2) * iVar6];
      iVar3 = out[ws._4_4_ + 2 + ((int)ws + 2) * iVar6];
      iVar4 = out[ws._4_4_ + 1 + ((int)ws + 1) * iVar6];
      if ((iVar4 == 0) && ((((iVar9 != 0 || (iVar1 != 0)) || (iVar2 != 0)) || (iVar3 != 0)))) {
        lVar8 = ws._4_4_ + areaX + lVar7;
        lVar8 = (int)ws + areaZ + (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8;
        lVar8 = ws._4_4_ + areaX + (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8;
        _inc = (int)ws + areaZ + (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8;
        chunkX_1._4_4_ = 1;
        cVar10 = iVar9 != 0;
        if ((bool)cVar10) {
          _inc = lVar5 + (_inc * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * _inc;
          chunkX_1._4_4_ = iVar9;
        }
        if (iVar1 != 0) {
          cVar10 = cVar10 + '\x01';
          if ((cVar10 == '\x01') || ((_inc & 0x1000000) == 0)) {
            chunkX_1._4_4_ = iVar1;
          }
          _inc = lVar5 + (_inc * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * _inc;
        }
        if (iVar2 != 0) {
          cVar10 = cVar10 + '\x01';
          iVar9 = iVar2;
          if (cVar10 != '\x01') {
            iVar9 = chunkX_1._4_4_;
            if (cVar10 == '\x02') {
              if ((_inc & 0x1000000) == 0) {
                iVar9 = iVar2;
              }
            }
            else if (((long)_inc >> 0x18) % 3 == 0) {
              iVar9 = iVar2;
            }
          }
          chunkX_1._4_4_ = iVar9;
          _inc = lVar5 + (_inc * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * _inc;
        }
        if (iVar3 != 0) {
          iVar9 = iVar3;
          if (cVar10 != '\0') {
            iVar9 = chunkX_1._4_4_;
            if (cVar10 == '\x01') {
              if ((_inc & 0x1000000) == 0) {
                iVar9 = iVar3;
              }
            }
            else if (cVar10 == '\x02') {
              if (((long)_inc >> 0x18) % 3 == 0) {
                iVar9 = iVar3;
              }
            }
            else if ((_inc & 0x3000000) == 0) {
              iVar9 = iVar3;
            }
          }
          chunkX_1._4_4_ = iVar9;
          _inc = lVar5 + (_inc * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * _inc;
        }
        if (((long)_inc >> 0x18) % 3 == 0) {
          out[ws._4_4_ + (int)ws * areaWidth] = chunkX_1._4_4_;
        }
        else if (chunkX_1._4_4_ == 4) {
          out[ws._4_4_ + (int)ws * areaWidth] = 4;
        }
        else {
          out[ws._4_4_ + (int)ws * areaWidth] = 0;
        }
      }
      else if ((iVar4 < 1) || (((iVar9 != 0 && (iVar1 != 0)) && ((iVar2 != 0 && (iVar3 != 0)))))) {
        out[ws._4_4_ + (int)ws * areaWidth] = iVar4;
      }
      else {
        lVar8 = ws._4_4_ + areaX + lVar7;
        lVar8 = (int)ws + areaZ + (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8;
        lVar8 = ws._4_4_ + areaX + (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8;
        if (((int)ws + areaZ + (lVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar8 >> 0x18) %
            5 == 0) {
          iVar9 = 0;
          if (iVar4 == 4) {
            iVar9 = 4;
          }
          out[ws._4_4_ + (int)ws * areaWidth] = iVar9;
        }
        else {
          out[ws._4_4_ + (int)ws * areaWidth] = iVar4;
        }
      }
    }
  }
  return;
}

Assistant:

void mapAddIsland(Layer *l, int *__restrict out, long long areaX, long long areaZ, int areaWidth, int areaHeight) {
    int pX = (int)areaX - 1;
    int pZ = (int)areaZ - 1;
    int pWidth = areaWidth + 2;
    int pHeight = areaHeight + 2;
    int x, z;

    l->p->getMap(l->p, out, pX, pZ, pWidth, pHeight);

    const int64_t ws = l->worldSeed;
    const int64_t ss = ws * (ws * 6364136223846793005LL + 1442695040888963407LL);

    for (z = 0; z < areaHeight; z++) {
        for (x = 0; x < areaWidth; x++) {
            int v00 = out[x + 0 + (z + 0) * pWidth];
            int v20 = out[x + 2 + (z + 0) * pWidth];
            int v02 = out[x + 0 + (z + 2) * pWidth];
            int v22 = out[x + 2 + (z + 2) * pWidth];
            int v11 = out[x + 1 + (z + 1) * pWidth];

            if (v11 == 0 && (v00 != 0 || v20 != 0 || v02 != 0 || v22 != 0)) {
                const auto chunkX = (int64_t) (x + areaX);
                const auto chunkZ = (int64_t) (z + areaZ);
                int64_t cs = ss;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;

                int v = 1;
                int inc = 0;

                if (v00 != 0) {
                    ++inc;
                    v = v00;
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }
                if (v20 != 0) {
                    if (++inc == 1 || (cs & (1LL << 24)) == 0) v = v20;
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }
                if (v02 != 0) {
                    switch (++inc) {
                        case 1:
                            v = v02;
                            break;
                        case 2:
                            if ((cs & (1LL << 24)) == 0) v = v02;
                            break;
                        default:
                            if (((cs >> 24) % 3) == 0) v = v02;
                    }
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }
                if (v22 != 0) {
                    switch (++inc) {
                        case 1:
                            v = v22;
                            break;
                        case 2:
                            if ((cs & (1LL << 24)) == 0) v = v22;
                            break;
                        case 3:
                            if (((cs >> 24) % 3) == 0) v = v22;
                            break;
                        default:
                            if ((cs & (3LL << 24)) == 0) v = v22;
                    }
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }

                if ((cs >> 24) % 3 == 0)
                    out[x + z * areaWidth] = v;
                else if (v == 4)
                    out[x + z * areaWidth] = 4;
                else
                    out[x + z * areaWidth] = 0;
            } else if (v11 > 0 && (v00 == 0 || v20 == 0 || v02 == 0 || v22 == 0)) {
                //setChunkSeed(l, (int64_t)(x + areaX), (int64_t)(z + areaZ));
                //if (mcNextInt(l, 5) == 0)...

                const auto chunkX = (int64_t) (x + areaX);
                const auto chunkZ = (int64_t) (z + areaZ);

                int64_t cs = ss;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;

                if ((cs >> 24) % 5 == 0)
                    out[x + z * areaWidth] = (v11 == 4) ? 4 : 0;
                else
                    out[x + z * areaWidth] = v11;
            } else {
                out[x + z * areaWidth] = v11;
            }
        }
    }
}